

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTcConstVal::is_equal_to(CTcConstVal *this,CTcConstVal *val)

{
  tc_constval_type_t tVar1;
  int iVar2;
  tc_constval_type_t tVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  char *__s1;
  char *__s2;
  CTPNListBase *pCVar11;
  CTcConstVal *val_00;
  CTcPrsNode *pCVar12;
  ulong uVar13;
  ulong uVar14;
  CTcSymFunc *pCVar15;
  CTcSymFunc *pCVar16;
  CTcConstVal *in_RSI;
  CTcConstVal *in_RDI;
  vbignum_t b_2;
  vbignum_t a_2;
  vbignum_t b_1;
  vbignum_t a_1;
  vbignum_t b;
  vbignum_t a;
  CTPNListEle *ele2;
  CTPNListEle *ele1;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  vbignum_t *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  vbignum_t *in_stack_ffffffffffffff00;
  bool local_cd;
  CTPNListEleBase *local_28;
  uint local_4;
  
  if ((in_RDI->typ_ == TC_CVT_INT) && (tVar1 = get_type(in_RSI), tVar1 == TC_CVT_FLOAT)) {
    get_val_int(in_RDI);
    vbignum_t::vbignum_t
              (in_stack_fffffffffffffef0,
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    get_val_float(in_RSI);
    get_val_float_len(in_RSI);
    vbignum_t::vbignum_t
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    iVar2 = vbignum_t::compare(in_stack_fffffffffffffef0,
                               (vbignum_t *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_4 = (uint)(iVar2 == 0);
    vbignum_t::~vbignum_t(in_stack_fffffffffffffef0);
    vbignum_t::~vbignum_t(in_stack_fffffffffffffef0);
  }
  else if ((in_RDI->typ_ == TC_CVT_FLOAT) && (tVar1 = get_type(in_RSI), tVar1 == TC_CVT_INT)) {
    get_val_float(in_RDI);
    get_val_float_len(in_RDI);
    vbignum_t::vbignum_t
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
               (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    get_val_int(in_RSI);
    vbignum_t::vbignum_t
              (in_stack_fffffffffffffef0,
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    iVar2 = vbignum_t::compare(in_stack_fffffffffffffef0,
                               (vbignum_t *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    local_4 = (uint)(iVar2 == 0);
    vbignum_t::~vbignum_t(in_stack_fffffffffffffef0);
    vbignum_t::~vbignum_t(in_stack_fffffffffffffef0);
  }
  else {
    tVar1 = in_RDI->typ_;
    tVar3 = get_type(in_RSI);
    if (tVar1 == tVar3) {
      switch(in_RDI->typ_) {
      case TC_CVT_UNK:
        local_4 = 0;
        break;
      case TC_CVT_NIL:
      case TC_CVT_TRUE:
        local_4 = 1;
        break;
      case TC_CVT_INT:
        lVar7 = get_val_int(in_RDI);
        lVar8 = get_val_int(in_RSI);
        local_4 = (uint)(lVar7 == lVar8);
        break;
      case TC_CVT_SSTR:
        sVar9 = get_val_str_len(in_RDI);
        sVar10 = get_val_str_len(in_RSI);
        local_cd = false;
        if (sVar9 == sVar10) {
          __s1 = get_val_str(in_RDI);
          __s2 = get_val_str(in_RSI);
          sVar9 = get_val_str_len(in_RDI);
          iVar2 = memcmp(__s1,__s2,sVar9);
          local_cd = iVar2 == 0;
        }
        local_4 = (uint)local_cd;
        break;
      default:
        local_4 = 0;
        break;
      case TC_CVT_LIST:
        pCVar11 = &get_val_list(in_RDI)->super_CTPNListBase;
        iVar2 = CTPNListBase::get_count(pCVar11);
        pCVar11 = &get_val_list(in_RSI)->super_CTPNListBase;
        iVar4 = CTPNListBase::get_count(pCVar11);
        if (iVar2 == iVar4) {
          pCVar11 = &get_val_list(in_RDI)->super_CTPNListBase;
          val_00 = (CTcConstVal *)CTPNListBase::get_head(pCVar11);
          pCVar11 = &get_val_list(in_RSI)->super_CTPNListBase;
          for (local_28 = &CTPNListBase::get_head(pCVar11)->super_CTPNListEleBase;
              val_00 != (CTcConstVal *)0x0 && local_28 != (CTPNListEleBase *)0x0;
              local_28 = &CTPNListEleBase::get_next(local_28)->super_CTPNListEleBase) {
            pCVar12 = CTPNListEleBase::get_expr((CTPNListEleBase *)val_00);
            (*(pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
            pCVar12 = CTPNListEleBase::get_expr(local_28);
            (*(pCVar12->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
            iVar2 = is_equal_to(in_RSI,val_00);
            if (iVar2 == 0) {
              return 0;
            }
            val_00 = (CTcConstVal *)CTPNListEleBase::get_next((CTPNListEleBase *)val_00);
          }
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
        break;
      case TC_CVT_OBJ:
        uVar13 = get_val_obj(in_RDI);
        uVar14 = get_val_obj(in_RSI);
        local_4 = (uint)(uVar13 == uVar14);
        break;
      case TC_CVT_PROP:
        uVar5 = get_val_prop(in_RDI);
        uVar6 = get_val_prop(in_RSI);
        local_4 = (uint)(uVar5 == uVar6);
        break;
      case TC_CVT_FUNCPTR:
        pCVar15 = get_val_funcptr_sym(in_RDI);
        pCVar16 = get_val_funcptr_sym(in_RSI);
        local_4 = (uint)(pCVar15 == pCVar16);
        break;
      case TC_CVT_FLOAT:
        get_val_float(in_RDI);
        get_val_float_len(in_RDI);
        vbignum_t::vbignum_t
                  (in_stack_ffffffffffffff00,
                   (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        get_val_float(in_RSI);
        get_val_float_len(in_RSI);
        vbignum_t::vbignum_t
                  (in_stack_ffffffffffffff00,
                   (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   (size_t)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        iVar2 = vbignum_t::compare(in_stack_fffffffffffffef0,
                                   (vbignum_t *)
                                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        local_4 = (uint)(iVar2 == 0);
        vbignum_t::~vbignum_t(in_stack_fffffffffffffef0);
        vbignum_t::~vbignum_t(in_stack_fffffffffffffef0);
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int CTcConstVal::is_equal_to(const CTcConstVal *val) const
{
    CTPNListEle *ele1;
    CTPNListEle *ele2;

    /* check for float-int comparisons */
    if (typ_ == TC_CVT_INT && val->get_type() == TC_CVT_FLOAT)
    {
        vbignum_t a(get_val_int());
        vbignum_t b(val->get_val_float(), val->get_val_float_len(), 0);
        return a.compare(b) == 0;
    }
    if (typ_ == TC_CVT_FLOAT && val->get_type() == TC_CVT_INT)
    {
        vbignum_t a(get_val_float(), get_val_float_len(), 0);
        vbignum_t b(val->get_val_int());
        return a.compare(b) == 0;
    }
    
    /* 
     *   if the types aren't equal, the values are not equal; otherwise,
     *   check the various types 
     */
    if (typ_ != val->get_type())
    {
        /* the types aren't equal, so the values are not equal */
        return FALSE;
    }

    /* the types are the same; do the comparison based on the type */
    switch(typ_)
    {
    case TC_CVT_UNK:
        /* unknown type; unknown values can never be equal */
        return FALSE;

    case TC_CVT_TRUE:
    case TC_CVT_NIL:
        /* 
         *   nil==nil and true==true; since we know the types are the
         *   same, the values are the same
         */
        return TRUE;

    case TC_CVT_INT:
        /* compare the integers */
        return (get_val_int() == val->get_val_int());

    case TC_CVT_FLOAT:
        {
            vbignum_t a(get_val_float(), get_val_float_len(), 0);
            vbignum_t b(val->get_val_float(), val->get_val_float_len(), 0);
            return a.compare(b) == 0;
        }

    case TC_CVT_SSTR:
        /* compare the strings */
        return (get_val_str_len() == val->get_val_str_len()
                && memcmp(get_val_str(), val->get_val_str(),
                          get_val_str_len()) == 0);
            
    case TC_CVT_LIST:
        /* 
         *   if the lists don't have the same number of elements, they're
         *   not equal 
         */
        if (get_val_list()->get_count() != val->get_val_list()->get_count())
            return FALSE;

        /* 
         *   compare each element of each list; if they're all the same,
         *   the values are the same 
         */
        ele1 = get_val_list()->get_head();
        ele2 = val->get_val_list()->get_head();
        for ( ; ele1 != 0 && ele2 != 0 ;
              ele1 = ele1->get_next(), ele2 = ele2->get_next())
        {
            /* if these elements aren't equal, the lists aren't equal */
            if (!ele1->get_expr()->get_const_val()
                ->is_equal_to(ele2->get_expr()->get_const_val()))
                return FALSE;
        }

        /* we didn't find any differences, so the lists are equal */
        return TRUE;

    case TC_CVT_OBJ:
        /* if the object values are the same, the values match */
        return (get_val_obj() == val->get_val_obj());

    case TC_CVT_PROP:
        /* if the property values are the same, the values match */
        return (get_val_prop() == val->get_val_prop());

    case TC_CVT_FUNCPTR:
        /* 
         *   if both symbols are the same, the values match; otherwise,
         *   they refer to different functions 
         */
        return (get_val_funcptr_sym() == val->get_val_funcptr_sym());

    default:
        /* unknown type; return unequal */
        return FALSE;
    }
}